

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O3

void __thiscall btSoftBody::solveConstraints(btSoftBody *this)

{
  btScalar *pbVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  Link *pLVar7;
  long lVar8;
  long lVar9;
  Anchor *pAVar10;
  btCollisionObject *this_00;
  Node *pNVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  long lVar15;
  code *pcVar16;
  ulong uVar17;
  int iVar18;
  long lVar19;
  int iVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  btVector3 ra;
  btVector3 local_70;
  btMatrix3x3 local_60;
  
  applyClusters(this,false);
  lVar15 = (long)(this->m_links).m_size;
  if (0 < lVar15) {
    lVar19 = 0;
    do {
      pLVar7 = (this->m_links).m_data;
      lVar8 = *(long *)((long)pLVar7->m_n + lVar19);
      lVar9 = *(long *)((long)pLVar7->m_n + lVar19 + 8);
      uVar4 = *(undefined8 *)(lVar9 + 0x20);
      uVar5 = *(undefined8 *)(lVar8 + 0x20);
      fVar23 = *(float *)(lVar9 + 0x28) - *(float *)(lVar8 + 0x28);
      fVar21 = (float)uVar4 - (float)uVar5;
      fVar22 = (float)((ulong)uVar4 >> 0x20) - (float)((ulong)uVar5 >> 0x20);
      auVar14._4_4_ = fVar22;
      auVar14._0_4_ = fVar21;
      auVar14._8_4_ = fVar23;
      auVar14._12_4_ = 0;
      *(undefined1 (*) [16])((long)(pLVar7->m_c3).m_floats + lVar19) = auVar14;
      *(float *)((long)(pLVar7->m_c3).m_floats + lVar19 + -4) =
           1.0 / ((fVar23 * fVar23 + fVar21 * fVar21 + fVar22 * fVar22) *
                 *(float *)((long)(pLVar7->m_c3).m_floats + lVar19 + -0xc));
      lVar19 = lVar19 + 0x48;
    } while (lVar15 * 0x48 != lVar19);
  }
  lVar15 = (long)(this->m_anchors).m_size;
  if (0 < lVar15) {
    lVar19 = 0;
    do {
      pAVar10 = (this->m_anchors).m_data;
      this_00 = *(btCollisionObject **)((long)(pAVar10->m_c0).m_el[0].m_floats + lVar19 + -0xc);
      fVar21 = *(float *)((long)(pAVar10->m_local).m_floats + lVar19);
      fVar22 = *(float *)((long)(pAVar10->m_local).m_floats + lVar19 + 4);
      fVar23 = *(float *)((long)(pAVar10->m_local).m_floats + lVar19 + 8);
      local_70.m_floats[1] =
           fVar23 * (this_00->m_worldTransform).m_basis.m_el[1].m_floats[2] +
           fVar21 * (this_00->m_worldTransform).m_basis.m_el[1].m_floats[0] +
           (this_00->m_worldTransform).m_basis.m_el[1].m_floats[1] * fVar22;
      local_70.m_floats[0] =
           fVar23 * (this_00->m_worldTransform).m_basis.m_el[0].m_floats[2] +
           fVar21 * (this_00->m_worldTransform).m_basis.m_el[0].m_floats[0] +
           (this_00->m_worldTransform).m_basis.m_el[0].m_floats[1] * fVar22;
      local_70.m_floats[2] =
           fVar23 * (this_00->m_worldTransform).m_basis.m_el[2].m_floats[2] +
           fVar21 * (this_00->m_worldTransform).m_basis.m_el[2].m_floats[0] +
           fVar22 * (this_00->m_worldTransform).m_basis.m_el[2].m_floats[1];
      local_70.m_floats[3] = 0.0;
      lVar8 = *(long *)((long)(pAVar10->m_local).m_floats + lVar19 + -8);
      ImpulseMatrix(&local_60,(this->m_sst).sdt,*(btScalar *)(lVar8 + 0x60),
                    this_00[1].m_interpolationWorldTransform.m_basis.m_el[0].m_floats[1],
                    (btMatrix3x3 *)&this_00->field_0x14c,&local_70);
      pbVar1 = (btScalar *)((long)(pAVar10->m_c0).m_el[0].m_floats + lVar19);
      *(undefined8 *)pbVar1 = local_60.m_el[0].m_floats._0_8_;
      *(undefined8 *)(pbVar1 + 2) = local_60.m_el[0].m_floats._8_8_;
      pbVar1 = (btScalar *)((long)(pAVar10->m_c0).m_el[1].m_floats + lVar19);
      *(undefined8 *)pbVar1 = local_60.m_el[1].m_floats._0_8_;
      *(undefined8 *)(pbVar1 + 2) = local_60.m_el[1].m_floats._8_8_;
      pbVar1 = (btScalar *)((long)(pAVar10->m_c0).m_el[2].m_floats + lVar19);
      *(undefined8 *)pbVar1 = local_60.m_el[2].m_floats._0_8_;
      *(undefined8 *)(pbVar1 + 2) = local_60.m_el[2].m_floats._8_8_;
      pbVar1 = (btScalar *)((long)(pAVar10->m_c1).m_floats + lVar19);
      *(undefined8 *)pbVar1 = local_70.m_floats._0_8_;
      *(undefined8 *)(pbVar1 + 2) = local_70.m_floats._8_8_;
      *(float *)((long)(&pAVar10->m_c1 + 1) + lVar19) = (this->m_sst).sdt * *(float *)(lVar8 + 0x60)
      ;
      btCollisionObject::activate(this_00,false);
      lVar19 = lVar19 + 0x68;
    } while (lVar15 * 0x68 - lVar19 != 0);
  }
  iVar18 = (this->m_cfg).viterations;
  if (0 < iVar18) {
    uVar17 = (ulong)(uint)(this->m_cfg).m_vsequence.m_size;
    iVar20 = 0;
    do {
      if (0 < (int)uVar17) {
        lVar15 = 0;
        do {
          pcVar16 = VSolve_Links;
          if ((this->m_cfg).m_vsequence.m_data[lVar15] != Linear) {
            pcVar16 = (code *)0x0;
          }
          (*pcVar16)(0x3f800000,this);
          lVar15 = lVar15 + 1;
          uVar17 = (ulong)(this->m_cfg).m_vsequence.m_size;
        } while (lVar15 < (long)uVar17);
        iVar18 = (this->m_cfg).viterations;
      }
      iVar20 = iVar20 + 1;
    } while (iVar20 < iVar18);
    lVar15 = (long)(this->m_nodes).m_size;
    if (0 < lVar15) {
      lVar19 = 0;
      do {
        pNVar11 = (this->m_nodes).m_data;
        fVar21 = (this->m_sst).sdt;
        uVar4 = *(undefined8 *)((long)(pNVar11->m_q).m_floats + lVar19);
        uVar5 = *(undefined8 *)((long)(pNVar11->m_v).m_floats + lVar19);
        auVar12._4_4_ = fVar21 * (float)((ulong)uVar5 >> 0x20) + (float)((ulong)uVar4 >> 0x20);
        auVar12._0_4_ = fVar21 * (float)uVar5 + (float)uVar4;
        auVar12._8_4_ =
             *(float *)((long)(pNVar11->m_v).m_floats + lVar19 + 8) * fVar21 +
             *(float *)((long)(pNVar11->m_q).m_floats + lVar19 + 8);
        auVar12._12_4_ = 0;
        *(undefined1 (*) [16])((long)(pNVar11->m_x).m_floats + lVar19) = auVar12;
        lVar19 = lVar19 + 0x78;
      } while (lVar15 * 0x78 - lVar19 != 0);
    }
  }
  iVar18 = (this->m_cfg).piterations;
  if (0 < iVar18) {
    uVar17 = (ulong)(uint)(this->m_cfg).m_psequence.m_size;
    iVar20 = 0;
    do {
      if (0 < (int)uVar17) {
        lVar15 = 0;
        do {
          (*(code *)(&PTR_PSolve_Links_00221518)[(int)(this->m_cfg).m_psequence.m_data[lVar15]])
                    (this);
          lVar15 = lVar15 + 1;
          uVar17 = (ulong)(this->m_cfg).m_psequence.m_size;
        } while (lVar15 < (long)uVar17);
        iVar18 = (this->m_cfg).piterations;
      }
      iVar20 = iVar20 + 1;
    } while (iVar20 < iVar18);
    lVar15 = (long)(this->m_nodes).m_size;
    if (0 < lVar15) {
      fVar21 = (1.0 - (this->m_cfg).kDP) * (this->m_sst).isdt;
      lVar19 = 0;
      do {
        pNVar11 = (this->m_nodes).m_data;
        uVar4 = *(undefined8 *)((long)(pNVar11->m_x).m_floats + lVar19);
        uVar5 = *(undefined8 *)((long)(pNVar11->m_q).m_floats + lVar19);
        auVar13._4_4_ = ((float)((ulong)uVar4 >> 0x20) - (float)((ulong)uVar5 >> 0x20)) * fVar21;
        auVar13._0_4_ = ((float)uVar4 - (float)uVar5) * fVar21;
        auVar13._8_4_ =
             (*(float *)((long)(pNVar11->m_x).m_floats + lVar19 + 8) -
             *(float *)((long)(pNVar11->m_q).m_floats + lVar19 + 8)) * fVar21;
        auVar13._12_4_ = 0;
        *(undefined1 (*) [16])((long)(pNVar11->m_v).m_floats + lVar19) = auVar13;
        puVar2 = (undefined8 *)((long)(pNVar11->m_f).m_floats + lVar19);
        *puVar2 = 0;
        puVar2[1] = 0;
        lVar19 = lVar19 + 0x78;
      } while (lVar15 * 0x78 - lVar19 != 0);
    }
  }
  iVar18 = (this->m_cfg).diterations;
  if (iVar18 < 1) goto LAB_001dd635;
  fVar21 = (this->m_cfg).kVCF * (this->m_sst).isdt;
  lVar15 = (long)(this->m_nodes).m_size;
  if (lVar15 < 1) {
LAB_001dd57e:
    uVar17 = (ulong)(uint)(this->m_cfg).m_dsequence.m_size;
    iVar20 = 0;
    do {
      if (0 < (int)uVar17) {
        lVar15 = 0;
        do {
          (*(code *)(&PTR_PSolve_Links_00221518)[(int)(this->m_cfg).m_dsequence.m_data[lVar15]])
                    (0x3f800000,0,this);
          lVar15 = lVar15 + 1;
          uVar17 = (ulong)(this->m_cfg).m_dsequence.m_size;
        } while (lVar15 < (long)uVar17);
        iVar18 = (this->m_cfg).diterations;
      }
      iVar20 = iVar20 + 1;
    } while (iVar20 < iVar18);
  }
  else {
    lVar19 = 0;
    do {
      pNVar11 = (this->m_nodes).m_data;
      puVar2 = (undefined8 *)((long)(pNVar11->m_x).m_floats + lVar19);
      uVar4 = puVar2[1];
      puVar3 = (undefined8 *)((long)(pNVar11->m_q).m_floats + lVar19);
      *puVar3 = *puVar2;
      puVar3[1] = uVar4;
      lVar19 = lVar19 + 0x78;
    } while (lVar15 * 0x78 - lVar19 != 0);
    iVar18 = (this->m_cfg).diterations;
    if (0 < iVar18) goto LAB_001dd57e;
  }
  lVar15 = (long)(this->m_nodes).m_size;
  if (0 < lVar15) {
    pNVar11 = (this->m_nodes).m_data;
    lVar19 = 0;
    do {
      fVar22 = *(float *)((long)(pNVar11->m_x).m_floats + lVar19 + 8);
      fVar23 = *(float *)((long)(pNVar11->m_q).m_floats + lVar19 + 8);
      uVar4 = *(undefined8 *)((long)(pNVar11->m_x).m_floats + lVar19);
      uVar5 = *(undefined8 *)((long)(pNVar11->m_q).m_floats + lVar19);
      uVar6 = *(undefined8 *)((long)(pNVar11->m_v).m_floats + lVar19);
      *(ulong *)((long)(pNVar11->m_v).m_floats + lVar19) =
           CONCAT44((float)((ulong)uVar6 >> 0x20) +
                    ((float)((ulong)uVar4 >> 0x20) - (float)((ulong)uVar5 >> 0x20)) * fVar21,
                    (float)uVar6 + ((float)uVar4 - (float)uVar5) * fVar21);
      *(float *)((long)(pNVar11->m_v).m_floats + lVar19 + 8) =
           (fVar22 - fVar23) * fVar21 + *(float *)((long)(pNVar11->m_v).m_floats + lVar19 + 8);
      lVar19 = lVar19 + 0x78;
    } while (lVar15 * 0x78 - lVar19 != 0);
  }
LAB_001dd635:
  dampClusters(this);
  applyClusters(this,true);
  return;
}

Assistant:

void			btSoftBody::solveConstraints()
{

	/* Apply clusters		*/ 
	applyClusters(false);
	/* Prepare links		*/ 

	int i,ni;

	for(i=0,ni=m_links.size();i<ni;++i)
	{
		Link&	l=m_links[i];
		l.m_c3		=	l.m_n[1]->m_q-l.m_n[0]->m_q;
		l.m_c2		=	1/(l.m_c3.length2()*l.m_c0);
	}
	/* Prepare anchors		*/ 
	for(i=0,ni=m_anchors.size();i<ni;++i)
	{
		Anchor&			a=m_anchors[i];
		const btVector3	ra=a.m_body->getWorldTransform().getBasis()*a.m_local;
		a.m_c0	=	ImpulseMatrix(	m_sst.sdt,
			a.m_node->m_im,
			a.m_body->getInvMass(),
			a.m_body->getInvInertiaTensorWorld(),
			ra);
		a.m_c1	=	ra;
		a.m_c2	=	m_sst.sdt*a.m_node->m_im;
		a.m_body->activate();
	}
	/* Solve velocities		*/ 
	if(m_cfg.viterations>0)
	{
		/* Solve			*/ 
		for(int isolve=0;isolve<m_cfg.viterations;++isolve)
		{
			for(int iseq=0;iseq<m_cfg.m_vsequence.size();++iseq)
			{
				getSolver(m_cfg.m_vsequence[iseq])(this,1);
			}
		}
		/* Update			*/ 
		for(i=0,ni=m_nodes.size();i<ni;++i)
		{
			Node&	n=m_nodes[i];
			n.m_x	=	n.m_q+n.m_v*m_sst.sdt;
		}
	}
	/* Solve positions		*/ 
	if(m_cfg.piterations>0)
	{
		for(int isolve=0;isolve<m_cfg.piterations;++isolve)
		{
			const btScalar ti=isolve/(btScalar)m_cfg.piterations;
			for(int iseq=0;iseq<m_cfg.m_psequence.size();++iseq)
			{
				getSolver(m_cfg.m_psequence[iseq])(this,1,ti);
			}
		}
		const btScalar	vc=m_sst.isdt*(1-m_cfg.kDP);
		for(i=0,ni=m_nodes.size();i<ni;++i)
		{
			Node&	n=m_nodes[i];
			n.m_v	=	(n.m_x-n.m_q)*vc;
			n.m_f	=	btVector3(0,0,0);		
		}
	}
	/* Solve drift			*/ 
	if(m_cfg.diterations>0)
	{
		const btScalar	vcf=m_cfg.kVCF*m_sst.isdt;
		for(i=0,ni=m_nodes.size();i<ni;++i)
		{
			Node&	n=m_nodes[i];
			n.m_q	=	n.m_x;
		}
		for(int idrift=0;idrift<m_cfg.diterations;++idrift)
		{
			for(int iseq=0;iseq<m_cfg.m_dsequence.size();++iseq)
			{
				getSolver(m_cfg.m_dsequence[iseq])(this,1,0);
			}
		}
		for(int i=0,ni=m_nodes.size();i<ni;++i)
		{
			Node&	n=m_nodes[i];
			n.m_v	+=	(n.m_x-n.m_q)*vcf;
		}
	}
	/* Apply clusters		*/ 
	dampClusters();
	applyClusters(true);
}